

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Cube::setupBackFace(Cube *this)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = this->z;
  this->positionData[0x14] = fVar1;
  this->positionData[0x17] = fVar1;
  uVar2._0_4_ = this->x;
  uVar2._4_4_ = this->y;
  fVar3 = this->l + (float)(undefined4)uVar2;
  fVar4 = this->h + (float)uVar2._4_4_;
  *(undefined8 *)(this->positionData + 0x12) = uVar2;
  this->positionData[0x15] = fVar3;
  this->positionData[0x16] = (float)uVar2._4_4_;
  *(ulong *)(this->positionData + 0x18) = CONCAT44(fVar4,fVar3);
  this->positionData[0x1a] = fVar1;
  *(undefined8 *)(this->positionData + 0x1b) = uVar2;
  this->positionData[0x1d] = fVar1;
  *(ulong *)(this->positionData + 0x1e) = CONCAT44(fVar4,fVar3);
  this->positionData[0x20] = fVar1;
  this->positionData[0x21] = (float)(undefined4)uVar2;
  this->positionData[0x22] = fVar4;
  this->positionData[0x23] = fVar1;
  return;
}

Assistant:

void setupBackFace() {
        float backFace[]={
            x,y,z,
            x+l,y,z,
            x+l,y+h,z,
            x,y,z,


            x+l,y+h,z,
            x,y+h,z
        };
        arrayCopy(backFace,positionData,18);
    }